

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_reader_init_stdfile(mpack_reader_t *reader,FILE *file,_Bool close_when_done)

{
  char *pcVar1;
  code *pcVar2;
  
  pcVar1 = (char *)malloc(0x1000);
  reader->context = (void *)0x0;
  reader->fill = (mpack_reader_fill_t)0x0;
  reader->error_fn = (mpack_reader_error_t)0x0;
  reader->teardown = (mpack_reader_teardown_t)0x0;
  reader->skip = (mpack_reader_skip_t)0x0;
  reader->buffer = (char *)0x0;
  reader->size = 0;
  reader->data = (char *)0x0;
  reader->end = (char *)0x0;
  *(undefined8 *)&reader->error = 0;
  if (pcVar1 == (char *)0x0) {
    reader->error = mpack_error_memory;
    if (close_when_done) {
      fclose((FILE *)file);
      return;
    }
  }
  else {
    reader->buffer = pcVar1;
    reader->size = 0x1000;
    reader->data = pcVar1;
    reader->end = pcVar1;
    reader->context = file;
    mpack_reader_set_fill(reader,mpack_file_reader_fill);
    reader->skip = mpack_file_reader_skip;
    pcVar2 = mpack_file_reader_teardown;
    if (close_when_done) {
      pcVar2 = mpack_file_reader_teardown_close;
    }
    reader->teardown = pcVar2;
  }
  return;
}

Assistant:

void mpack_reader_init_stdfile(mpack_reader_t* reader, FILE* file, bool close_when_done) {
    mpack_assert(file != NULL, "file is NULL");

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_reader_init_error(reader, mpack_error_memory);
        if (close_when_done) {
            fclose(file);
        }
        return;
    }

    mpack_reader_init(reader, buffer, capacity, 0);
    mpack_reader_set_context(reader, file);
    mpack_reader_set_fill(reader, mpack_file_reader_fill);
    mpack_reader_set_skip(reader, mpack_file_reader_skip);
    mpack_reader_set_teardown(reader, close_when_done ?
            mpack_file_reader_teardown_close :
            mpack_file_reader_teardown);
}